

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Stats.cpp
# Opt level: O1

Stats * __thiscall clunk::Stats::operator+=(Stats *this,Stats *other)

{
  this->statCount = this->statCount + 1;
  this->ttGets = this->ttGets + other->ttGets;
  this->ttHits = this->ttHits + other->ttHits;
  this->ttMates = this->ttMates + other->ttMates;
  this->ttStales = this->ttStales + other->ttStales;
  this->ptGets = this->ptGets + other->ptGets;
  this->ptHits = this->ptHits + other->ptHits;
  this->snodes = this->snodes + other->snodes;
  this->qnodes = this->qnodes + other->qnodes;
  this->chkExts = this->chkExts + other->chkExts;
  this->oneReplyExts = this->oneReplyExts + other->oneReplyExts;
  this->hashExts = this->hashExts + other->hashExts;
  this->execs = this->execs + other->execs;
  this->qexecs = this->qexecs + other->qexecs;
  this->deltaCount = this->deltaCount + other->deltaCount;
  this->staticNM = this->staticNM + other->staticNM;
  this->rzrCount = this->rzrCount + other->rzrCount;
  this->rzrEarlyOut = this->rzrEarlyOut + other->rzrEarlyOut;
  this->rzrCutoffs = this->rzrCutoffs + other->rzrCutoffs;
  this->iidCount = this->iidCount + other->iidCount;
  this->nullMoves = this->nullMoves + other->nullMoves;
  this->nmCutoffs = this->nmCutoffs + other->nmCutoffs;
  this->nmrCandidates = this->nmrCandidates + other->nmrCandidates;
  this->nmReductions = this->nmReductions + other->nmReductions;
  this->nmrBackfires = this->nmrBackfires + other->nmrBackfires;
  this->lateMoves = this->lateMoves + other->lateMoves;
  this->lmCandidates = this->lmCandidates + other->lmCandidates;
  this->lmReductions = this->lmReductions + other->lmReductions;
  this->lmResearches = this->lmResearches + other->lmResearches;
  this->lmConfirmed = this->lmConfirmed + other->lmConfirmed;
  this->lmAlphaIncs = this->lmAlphaIncs + other->lmAlphaIncs;
  return this;
}

Assistant:

Stats& Stats::operator+=(const Stats& other) {
  statCount     += 1;
  ttGets        += other.ttGets;
  ttHits        += other.ttHits;
  ttMates       += other.ttMates;
  ttStales      += other.ttStales;
  ptGets        += other.ptGets;
  ptHits        += other.ptHits;
  snodes        += other.snodes;
  qnodes        += other.qnodes;
  chkExts       += other.chkExts;
  oneReplyExts  += other.oneReplyExts;
  hashExts      += other.hashExts;
  execs         += other.execs;
  qexecs        += other.qexecs;
  deltaCount    += other.deltaCount;
  staticNM      += other.staticNM;
  rzrCount      += other.rzrCount;
  rzrEarlyOut   += other.rzrEarlyOut;
  rzrCutoffs    += other.rzrCutoffs;
  iidCount      += other.iidCount;
  nullMoves     += other.nullMoves;
  nmCutoffs     += other.nmCutoffs;
  nmrCandidates += other.nmrCandidates;
  nmReductions  += other.nmReductions;
  nmrBackfires  += other.nmrBackfires;
  lateMoves     += other.lateMoves;
  lmCandidates  += other.lmCandidates;
  lmReductions  += other.lmReductions;
  lmResearches  += other.lmResearches;
  lmConfirmed   += other.lmConfirmed;
  lmAlphaIncs   += other.lmAlphaIncs;
  return *this;
}